

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::SumBatches::forward_impl
          (SumBatches *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  float *pfVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  PointerType pfVar12;
  uint uVar13;
  ulong uVar14;
  Index index_1;
  ulong uVar15;
  Index index_3;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ushort uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  uint uVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> res;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  add_assign_op<float,_float> local_115;
  uint local_114;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_110;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_108;
  PointerType local_e8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>
  local_e0;
  DstEvaluatorType local_c0;
  undefined1 local_a8 [16];
  variable_if_dynamic<long,__1> local_98;
  float *local_90;
  ulong local_80;
  float *local_78;
  ulong local_68;
  float *local_60;
  ulong local_50;
  float *local_48;
  ulong local_38;
  
  ppTVar1 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_110 = xs;
  if ((long)(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 != 8) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,900,
                  "virtual void cnn::SumBatches::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  uVar13 = ((*ppTVar1)->d).bd;
  Tensor::operator*(&local_108,fx);
  uVar20 = uVar13 & 3;
  local_114 = uVar13;
  switch(uVar20) {
  case 0:
    if ((local_108.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value |
        local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
                   );
    }
    uVar14 = local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value *
             local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
    uVar15 = uVar14;
    if ((((ulong)local_108.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar15 = (ulong)(-((uint)((ulong)local_108.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 0xf),
       (long)uVar14 <= (long)uVar15)) {
      uVar15 = uVar14;
    }
    uVar11 = uVar14 - uVar15;
    uVar18 = uVar11 + 0xf;
    if (-1 < (long)uVar11) {
      uVar18 = uVar11;
    }
    pfVar12 = local_108.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
    if (0 < (long)uVar15) {
      local_e8 = local_108.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data;
      memset(local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data,0,uVar15 * 4);
      pfVar12 = local_e8;
    }
    lVar16 = (uVar18 & 0xfffffffffffffff0) + uVar15;
    if (0xf < (long)uVar11) {
      lVar10 = uVar15 + 0x10;
      if ((long)(uVar15 + 0x10) < lVar16) {
        lVar10 = lVar16;
      }
      memset(pfVar12 + uVar15,0,(~uVar15 + lVar10 & 0xfffffffffffffff0) * 4 + 0x40);
    }
    if (uVar14 - lVar16 != 0 && lVar16 <= (long)uVar14) {
      memset(pfVar12 + ((long)uVar18 >> 4) * 0x10 + uVar15,0,(uVar14 - lVar16) * 4);
    }
    break;
  case 1:
    pTVar2 = *(local_110->
              super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    local_a8._0_8_ = pTVar2->v;
    local_a8._8_8_ = ZEXT48((pTVar2->d).d[0]);
    local_98.m_value = 1;
    if (1 < (pTVar2->d).nd) {
      local_98.m_value = (long)(pTVar2->d).d[1];
    }
    Eigen::MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
    ::operator=(&local_108.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                ,(MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  *)local_a8);
    break;
  case 2:
    pTVar2 = *(local_110->
              super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    uVar14 = (ulong)(pTVar2->d).nd;
    uVar13 = 1;
    uVar15 = (ulong)(pTVar2->d).d[1];
    if (uVar14 < 2) {
      uVar15 = 1;
    }
    if (uVar14 != 0) {
      auVar23 = vpbroadcastq_avx512f();
      auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar18 = 0;
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar27 = vmovdqa64_avx512f(auVar24);
        auVar24 = vpbroadcastq_avx512f();
        auVar28 = vporq_avx512f(auVar24,auVar25);
        auVar24 = vporq_avx512f(auVar24,auVar26);
        uVar7 = vpcmpuq_avx512f(auVar24,auVar23,2);
        bVar8 = (byte)uVar7;
        uVar7 = vpcmpuq_avx512f(auVar28,auVar23,2);
        bVar9 = (byte)uVar7;
        uVar21 = CONCAT11(bVar9,bVar8);
        auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar18));
        auVar29._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar24._4_4_;
        auVar29._0_4_ = (uint)(bVar8 & 1) * auVar24._0_4_;
        auVar29._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar24._8_4_;
        auVar29._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar24._12_4_;
        auVar29._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar24._16_4_;
        auVar29._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar24._20_4_;
        auVar29._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar24._24_4_;
        auVar29._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar24._28_4_;
        auVar29._32_4_ = (uint)(bVar9 & 1) * auVar24._32_4_;
        auVar29._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar24._36_4_;
        auVar29._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar24._40_4_;
        auVar29._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar24._44_4_;
        auVar29._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar24._48_4_;
        auVar29._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar24._52_4_;
        auVar29._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar24._56_4_;
        auVar29._60_4_ = (uint)(bVar9 >> 7) * auVar24._60_4_;
        auVar24 = vpmulld_avx512f(auVar29,auVar27);
        uVar18 = uVar18 + 0x10;
      } while ((uVar14 + 0xf & 0xfffffffffffffff0) != uVar18);
      auVar23 = vmovdqa32_avx512f(auVar24);
      auVar26._0_4_ = (uint)(bVar8 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar27._0_4_;
      bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar4 * auVar23._4_4_ | (uint)!bVar4 * auVar27._4_4_;
      bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar4 * auVar23._8_4_ | (uint)!bVar4 * auVar27._8_4_;
      bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar4 * auVar23._12_4_ | (uint)!bVar4 * auVar27._12_4_;
      bVar4 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar26._16_4_ = (uint)bVar4 * auVar23._16_4_ | (uint)!bVar4 * auVar27._16_4_;
      bVar4 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar26._20_4_ = (uint)bVar4 * auVar23._20_4_ | (uint)!bVar4 * auVar27._20_4_;
      bVar4 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar26._24_4_ = (uint)bVar4 * auVar23._24_4_ | (uint)!bVar4 * auVar27._24_4_;
      bVar4 = (bool)((byte)(uVar21 >> 7) & 1);
      auVar26._28_4_ = (uint)bVar4 * auVar23._28_4_ | (uint)!bVar4 * auVar27._28_4_;
      auVar26._32_4_ =
           (uint)(bVar9 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar27._32_4_;
      bVar4 = (bool)(bVar9 >> 1 & 1);
      auVar26._36_4_ = (uint)bVar4 * auVar23._36_4_ | (uint)!bVar4 * auVar27._36_4_;
      bVar4 = (bool)(bVar9 >> 2 & 1);
      auVar26._40_4_ = (uint)bVar4 * auVar23._40_4_ | (uint)!bVar4 * auVar27._40_4_;
      bVar4 = (bool)(bVar9 >> 3 & 1);
      auVar26._44_4_ = (uint)bVar4 * auVar23._44_4_ | (uint)!bVar4 * auVar27._44_4_;
      bVar4 = (bool)(bVar9 >> 4 & 1);
      auVar26._48_4_ = (uint)bVar4 * auVar23._48_4_ | (uint)!bVar4 * auVar27._48_4_;
      bVar4 = (bool)(bVar9 >> 5 & 1);
      auVar26._52_4_ = (uint)bVar4 * auVar23._52_4_ | (uint)!bVar4 * auVar27._52_4_;
      bVar4 = (bool)(bVar9 >> 6 & 1);
      auVar26._56_4_ = (uint)bVar4 * auVar23._56_4_ | (uint)!bVar4 * auVar27._56_4_;
      auVar26._60_4_ =
           (uint)(bVar9 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar27._60_4_;
      auVar22 = vextracti64x4_avx512f(auVar26,1);
      auVar23 = vpmulld_avx512f(auVar26,ZEXT3264(auVar22));
      auVar5 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
      auVar6 = vpshufd_avx(auVar5,0xee);
      auVar5 = vpmulld_avx(auVar5,auVar6);
      auVar6 = vpshufd_avx(auVar5,0x55);
      auVar5 = vpmulld_avx(auVar5,auVar6);
      uVar13 = auVar5._0_4_;
    }
    uVar14 = 0;
    if ((pTVar2->d).bd != 1) {
      uVar14 = (ulong)uVar13;
    }
    if ((local_108.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value != (ulong)(pTVar2->d).d[0]) ||
       (local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value != uVar15)) {
LAB_001bd04b:
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
                   );
    }
    pfVar3 = pTVar2->v;
    uVar18 = local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value *
             local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
    uVar15 = uVar18;
    if ((((ulong)local_108.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar15 = (ulong)(-((uint)((ulong)local_108.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 0xf),
       (long)uVar18 <= (long)uVar15)) {
      uVar15 = uVar18;
    }
    uVar17 = uVar18 - uVar15;
    uVar11 = uVar17 + 0xf;
    if (-1 < (long)uVar17) {
      uVar11 = uVar17;
    }
    if (0 < (long)uVar15) {
      uVar19 = 0;
      do {
        local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar19] = pfVar3[uVar14 + uVar19] + pfVar3[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar15 != uVar19);
    }
    lVar16 = (uVar11 & 0xfffffffffffffff0) + uVar15;
    if (0xf < (long)uVar17) {
      do {
        auVar23 = vaddps_avx512f(*(undefined1 (*) [64])(pfVar3 + uVar14 + uVar15),
                                 *(undefined1 (*) [64])(pfVar3 + uVar15));
        *(undefined1 (*) [64])
         (local_108.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data + uVar15) = auVar23;
        uVar15 = uVar15 + 0x10;
      } while ((long)uVar15 < lVar16);
    }
    if (lVar16 < (long)uVar18) {
      do {
        local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar16] = pfVar3[uVar14 + lVar16] + pfVar3[lVar16];
        lVar16 = lVar16 + 1;
      } while (uVar18 - lVar16 != 0);
    }
    break;
  case 3:
    pTVar2 = *(local_110->
              super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)._M_impl
              .super__Vector_impl_data._M_start;
    uVar15 = (ulong)(pTVar2->d).nd;
    iVar38 = 1;
    uVar14 = (ulong)(pTVar2->d).d[1];
    if (uVar15 < 2) {
      uVar14 = 1;
    }
    uVar13 = (pTVar2->d).bd;
    uVar37 = 1;
    if (uVar15 != 0) {
      auVar23 = vpbroadcastq_avx512f();
      auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar18 = 0;
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar27 = vmovdqa64_avx512f(auVar24);
        auVar24 = vpbroadcastq_avx512f();
        auVar28 = vporq_avx512f(auVar24,auVar25);
        auVar24 = vporq_avx512f(auVar24,auVar26);
        uVar7 = vpcmpuq_avx512f(auVar24,auVar23,2);
        bVar8 = (byte)uVar7;
        uVar7 = vpcmpuq_avx512f(auVar28,auVar23,2);
        bVar9 = (byte)uVar7;
        uVar21 = CONCAT11(bVar9,bVar8);
        auVar28 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar18));
        auVar24._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar28._4_4_;
        auVar24._0_4_ = (uint)(bVar8 & 1) * auVar28._0_4_;
        auVar24._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar28._8_4_;
        auVar24._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar28._12_4_;
        auVar24._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar28._16_4_;
        auVar24._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar28._20_4_;
        auVar24._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar28._24_4_;
        auVar24._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar28._28_4_;
        auVar24._32_4_ = (uint)(bVar9 & 1) * auVar28._32_4_;
        auVar24._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar28._36_4_;
        auVar24._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar28._40_4_;
        auVar24._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar28._44_4_;
        auVar24._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar28._48_4_;
        auVar24._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar28._52_4_;
        auVar24._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar28._56_4_;
        auVar24._60_4_ = (uint)(bVar9 >> 7) * auVar28._60_4_;
        auVar24 = vpmulld_avx512f(auVar24,auVar27);
        uVar18 = uVar18 + 0x10;
      } while ((uVar15 + 0xf & 0x1fffffff0) != uVar18);
      auVar24 = vmovdqa32_avx512f(auVar24);
      auVar23._0_4_ = (uint)(bVar8 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar27._0_4_;
      bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar4 * auVar24._4_4_ | (uint)!bVar4 * auVar27._4_4_;
      bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar4 * auVar24._8_4_ | (uint)!bVar4 * auVar27._8_4_;
      bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar4 * auVar24._12_4_ | (uint)!bVar4 * auVar27._12_4_;
      bVar4 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar23._16_4_ = (uint)bVar4 * auVar24._16_4_ | (uint)!bVar4 * auVar27._16_4_;
      bVar4 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar23._20_4_ = (uint)bVar4 * auVar24._20_4_ | (uint)!bVar4 * auVar27._20_4_;
      bVar4 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar23._24_4_ = (uint)bVar4 * auVar24._24_4_ | (uint)!bVar4 * auVar27._24_4_;
      bVar4 = (bool)((byte)(uVar21 >> 7) & 1);
      auVar23._28_4_ = (uint)bVar4 * auVar24._28_4_ | (uint)!bVar4 * auVar27._28_4_;
      auVar23._32_4_ =
           (uint)(bVar9 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar27._32_4_;
      bVar4 = (bool)(bVar9 >> 1 & 1);
      auVar23._36_4_ = (uint)bVar4 * auVar24._36_4_ | (uint)!bVar4 * auVar27._36_4_;
      bVar4 = (bool)(bVar9 >> 2 & 1);
      auVar23._40_4_ = (uint)bVar4 * auVar24._40_4_ | (uint)!bVar4 * auVar27._40_4_;
      bVar4 = (bool)(bVar9 >> 3 & 1);
      auVar23._44_4_ = (uint)bVar4 * auVar24._44_4_ | (uint)!bVar4 * auVar27._44_4_;
      bVar4 = (bool)(bVar9 >> 4 & 1);
      auVar23._48_4_ = (uint)bVar4 * auVar24._48_4_ | (uint)!bVar4 * auVar27._48_4_;
      bVar4 = (bool)(bVar9 >> 5 & 1);
      auVar23._52_4_ = (uint)bVar4 * auVar24._52_4_ | (uint)!bVar4 * auVar27._52_4_;
      bVar4 = (bool)(bVar9 >> 6 & 1);
      auVar23._56_4_ = (uint)bVar4 * auVar24._56_4_ | (uint)!bVar4 * auVar27._56_4_;
      auVar23._60_4_ =
           (uint)(bVar9 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar27._60_4_;
      auVar22 = vextracti64x4_avx512f(auVar23,1);
      auVar23 = vpmulld_avx512f(auVar23,ZEXT3264(auVar22));
      auVar5 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
      auVar6 = vpshufd_avx(auVar5,0xee);
      auVar5 = vpmulld_avx(auVar5,auVar6);
      auVar6 = vpshufd_avx(auVar5,0x55);
      auVar5 = vpmulld_avx(auVar5,auVar6);
      uVar37 = auVar5._0_4_;
    }
    uVar18 = 0;
    if (uVar13 != 1) {
      uVar18 = (ulong)uVar37;
    }
    if (uVar15 != 0) {
      auVar23 = vpbroadcastq_avx512f();
      auVar24 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar11 = 0;
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar27 = vmovdqa64_avx512f(auVar24);
        auVar24 = vpbroadcastq_avx512f();
        auVar28 = vporq_avx512f(auVar24,auVar25);
        auVar24 = vporq_avx512f(auVar24,auVar26);
        uVar7 = vpcmpuq_avx512f(auVar24,auVar23,2);
        bVar8 = (byte)uVar7;
        uVar7 = vpcmpuq_avx512f(auVar28,auVar23,2);
        bVar9 = (byte)uVar7;
        uVar21 = CONCAT11(bVar9,bVar8);
        auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar11));
        auVar28._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar24._4_4_;
        auVar28._0_4_ = (uint)(bVar8 & 1) * auVar24._0_4_;
        auVar28._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar24._8_4_;
        auVar28._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar24._12_4_;
        auVar28._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar24._16_4_;
        auVar28._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar24._20_4_;
        auVar28._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar24._24_4_;
        auVar28._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar24._28_4_;
        auVar28._32_4_ = (uint)(bVar9 & 1) * auVar24._32_4_;
        auVar28._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar24._36_4_;
        auVar28._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar24._40_4_;
        auVar28._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar24._44_4_;
        auVar28._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar24._48_4_;
        auVar28._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar24._52_4_;
        auVar28._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar24._56_4_;
        auVar28._60_4_ = (uint)(bVar9 >> 7) * auVar24._60_4_;
        auVar24 = vpmulld_avx512f(auVar28,auVar27);
        uVar11 = uVar11 + 0x10;
      } while ((uVar15 + 0xf & 0x1fffffff0) != uVar11);
      auVar23 = vmovdqa32_avx512f(auVar24);
      auVar25._0_4_ = (uint)(bVar8 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar27._0_4_;
      bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar25._4_4_ = (uint)bVar4 * auVar23._4_4_ | (uint)!bVar4 * auVar27._4_4_;
      bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar25._8_4_ = (uint)bVar4 * auVar23._8_4_ | (uint)!bVar4 * auVar27._8_4_;
      bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar25._12_4_ = (uint)bVar4 * auVar23._12_4_ | (uint)!bVar4 * auVar27._12_4_;
      bVar4 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar25._16_4_ = (uint)bVar4 * auVar23._16_4_ | (uint)!bVar4 * auVar27._16_4_;
      bVar4 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar25._20_4_ = (uint)bVar4 * auVar23._20_4_ | (uint)!bVar4 * auVar27._20_4_;
      bVar4 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar25._24_4_ = (uint)bVar4 * auVar23._24_4_ | (uint)!bVar4 * auVar27._24_4_;
      bVar4 = (bool)((byte)(uVar21 >> 7) & 1);
      auVar25._28_4_ = (uint)bVar4 * auVar23._28_4_ | (uint)!bVar4 * auVar27._28_4_;
      auVar25._32_4_ =
           (uint)(bVar9 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar27._32_4_;
      bVar4 = (bool)(bVar9 >> 1 & 1);
      auVar25._36_4_ = (uint)bVar4 * auVar23._36_4_ | (uint)!bVar4 * auVar27._36_4_;
      bVar4 = (bool)(bVar9 >> 2 & 1);
      auVar25._40_4_ = (uint)bVar4 * auVar23._40_4_ | (uint)!bVar4 * auVar27._40_4_;
      bVar4 = (bool)(bVar9 >> 3 & 1);
      auVar25._44_4_ = (uint)bVar4 * auVar23._44_4_ | (uint)!bVar4 * auVar27._44_4_;
      bVar4 = (bool)(bVar9 >> 4 & 1);
      auVar25._48_4_ = (uint)bVar4 * auVar23._48_4_ | (uint)!bVar4 * auVar27._48_4_;
      bVar4 = (bool)(bVar9 >> 5 & 1);
      auVar25._52_4_ = (uint)bVar4 * auVar23._52_4_ | (uint)!bVar4 * auVar27._52_4_;
      bVar4 = (bool)(bVar9 >> 6 & 1);
      auVar25._56_4_ = (uint)bVar4 * auVar23._56_4_ | (uint)!bVar4 * auVar27._56_4_;
      auVar25._60_4_ =
           (uint)(bVar9 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar27._60_4_;
      auVar22 = vextracti64x4_avx512f(auVar25,1);
      auVar23 = vpmulld_avx512f(auVar25,ZEXT3264(auVar22));
      auVar5 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
      auVar6 = vpshufd_avx(auVar5,0xee);
      auVar5 = vpmulld_avx(auVar5,auVar6);
      auVar6 = vpshufd_avx(auVar5,0x55);
      auVar5 = vpmulld_avx(auVar5,auVar6);
      iVar38 = auVar5._0_4_;
    }
    if ((local_108.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value != (ulong)(pTVar2->d).d[0]) ||
       (local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value != uVar14)) goto LAB_001bd04b;
    pfVar3 = pTVar2->v;
    uVar13 = (int)(2 % (ulong)uVar13) * iVar38;
    uVar14 = local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value *
             local_108.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
    uVar15 = uVar14;
    if ((((ulong)local_108.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar15 = (ulong)(-((uint)((ulong)local_108.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 0xf),
       (long)uVar14 <= (long)uVar15)) {
      uVar15 = uVar14;
    }
    uVar17 = uVar14 - uVar15;
    uVar11 = uVar17 + 0xf;
    if (-1 < (long)uVar17) {
      uVar11 = uVar17;
    }
    if (0 < (long)uVar15) {
      uVar19 = 0;
      do {
        local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar19] = pfVar3[uVar18 + uVar19] + pfVar3[uVar19] + pfVar3[uVar13 + uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar15 != uVar19);
    }
    lVar16 = (uVar11 & 0xfffffffffffffff0) + uVar15;
    if (0xf < (long)uVar17) {
      do {
        auVar23 = vaddps_avx512f(*(undefined1 (*) [64])(pfVar3 + uVar18 + uVar15),
                                 *(undefined1 (*) [64])(pfVar3 + uVar15));
        auVar23 = vaddps_avx512f(auVar23,*(undefined1 (*) [64])(pfVar3 + uVar13 + uVar15));
        *(undefined1 (*) [64])
         (local_108.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data + uVar15) = auVar23;
        uVar15 = uVar15 + 0x10;
      } while ((long)uVar15 < lVar16);
    }
    if (lVar16 < (long)uVar14) {
      do {
        local_108.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar16] = pfVar3[uVar18 + lVar16] + pfVar3[lVar16] + pfVar3[(ulong)uVar13 + lVar16];
        lVar16 = lVar16 + 1;
      } while (uVar14 - lVar16 != 0);
    }
  }
  if (3 < local_114) {
    auVar23 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      pTVar2 = *(local_110->
                super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar13 = (pTVar2->d).nd;
      uVar15 = (ulong)uVar13;
      iVar38 = 1;
      iVar39 = 1;
      if (uVar15 != 0) {
        auVar26 = vpbroadcastq_avx512f();
        uVar14 = 0;
        auVar27 = vmovdqa64_avx512f(auVar23);
        do {
          auVar28 = vmovdqa64_avx512f(auVar27);
          auVar27 = vpbroadcastq_avx512f();
          auVar29 = vporq_avx512f(auVar27,auVar24);
          auVar27 = vporq_avx512f(auVar27,auVar25);
          uVar7 = vpcmpuq_avx512f(auVar27,auVar26,2);
          bVar8 = (byte)uVar7;
          uVar7 = vpcmpuq_avx512f(auVar29,auVar26,2);
          bVar9 = (byte)uVar7;
          uVar21 = CONCAT11(bVar9,bVar8);
          auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar14));
          auVar30._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar27._4_4_;
          auVar30._0_4_ = (uint)(bVar8 & 1) * auVar27._0_4_;
          auVar30._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar27._8_4_;
          auVar30._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar27._12_4_;
          auVar30._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar27._16_4_;
          auVar30._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar27._20_4_;
          auVar30._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar27._24_4_;
          auVar30._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar27._28_4_;
          auVar30._32_4_ = (uint)(bVar9 & 1) * auVar27._32_4_;
          auVar30._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar27._36_4_;
          auVar30._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar27._40_4_;
          auVar30._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar27._44_4_;
          auVar30._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar27._48_4_;
          auVar30._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar27._52_4_;
          auVar30._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar27._56_4_;
          auVar30._60_4_ = (uint)(bVar9 >> 7) * auVar27._60_4_;
          auVar27 = vpmulld_avx512f(auVar30,auVar28);
          uVar14 = uVar14 + 0x10;
        } while ((uVar15 + 0xf & 0x1fffffff0) != uVar14);
        auVar26 = vmovdqa32_avx512f(auVar27);
        auVar27._0_4_ = (uint)(bVar8 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar28._0_4_
        ;
        bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar27._4_4_ = (uint)bVar4 * auVar26._4_4_ | (uint)!bVar4 * auVar28._4_4_;
        bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar27._8_4_ = (uint)bVar4 * auVar26._8_4_ | (uint)!bVar4 * auVar28._8_4_;
        bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar27._12_4_ = (uint)bVar4 * auVar26._12_4_ | (uint)!bVar4 * auVar28._12_4_;
        bVar4 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar27._16_4_ = (uint)bVar4 * auVar26._16_4_ | (uint)!bVar4 * auVar28._16_4_;
        bVar4 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar27._20_4_ = (uint)bVar4 * auVar26._20_4_ | (uint)!bVar4 * auVar28._20_4_;
        bVar4 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar27._24_4_ = (uint)bVar4 * auVar26._24_4_ | (uint)!bVar4 * auVar28._24_4_;
        bVar4 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar27._28_4_ = (uint)bVar4 * auVar26._28_4_ | (uint)!bVar4 * auVar28._28_4_;
        auVar27._32_4_ =
             (uint)(bVar9 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar28._32_4_;
        bVar4 = (bool)(bVar9 >> 1 & 1);
        auVar27._36_4_ = (uint)bVar4 * auVar26._36_4_ | (uint)!bVar4 * auVar28._36_4_;
        bVar4 = (bool)(bVar9 >> 2 & 1);
        auVar27._40_4_ = (uint)bVar4 * auVar26._40_4_ | (uint)!bVar4 * auVar28._40_4_;
        bVar4 = (bool)(bVar9 >> 3 & 1);
        auVar27._44_4_ = (uint)bVar4 * auVar26._44_4_ | (uint)!bVar4 * auVar28._44_4_;
        bVar4 = (bool)(bVar9 >> 4 & 1);
        auVar27._48_4_ = (uint)bVar4 * auVar26._48_4_ | (uint)!bVar4 * auVar28._48_4_;
        bVar4 = (bool)(bVar9 >> 5 & 1);
        auVar27._52_4_ = (uint)bVar4 * auVar26._52_4_ | (uint)!bVar4 * auVar28._52_4_;
        bVar4 = (bool)(bVar9 >> 6 & 1);
        auVar27._56_4_ = (uint)bVar4 * auVar26._56_4_ | (uint)!bVar4 * auVar28._56_4_;
        auVar27._60_4_ =
             (uint)(bVar9 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar28._60_4_;
        auVar22 = vextracti64x4_avx512f(auVar27,1);
        auVar26 = vpmulld_avx512f(auVar27,ZEXT3264(auVar22));
        auVar5 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
        auVar6 = vpshufd_avx(auVar5,0xee);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        auVar6 = vpshufd_avx(auVar5,0x55);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        iVar39 = auVar5._0_4_;
      }
      uVar37 = (pTVar2->d).bd;
      uVar14 = (ulong)(pTVar2->d).d[1];
      if (uVar13 < 2) {
        uVar14 = 1;
      }
      if (uVar15 != 0) {
        auVar26 = vpbroadcastq_avx512f();
        uVar18 = 0;
        auVar27 = vmovdqa64_avx512f(auVar23);
        do {
          auVar28 = vmovdqa64_avx512f(auVar27);
          auVar27 = vpbroadcastq_avx512f();
          auVar29 = vporq_avx512f(auVar27,auVar24);
          auVar27 = vporq_avx512f(auVar27,auVar25);
          uVar7 = vpcmpuq_avx512f(auVar27,auVar26,2);
          bVar8 = (byte)uVar7;
          uVar7 = vpcmpuq_avx512f(auVar29,auVar26,2);
          bVar9 = (byte)uVar7;
          uVar21 = CONCAT11(bVar9,bVar8);
          auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar18));
          auVar31._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar27._4_4_;
          auVar31._0_4_ = (uint)(bVar8 & 1) * auVar27._0_4_;
          auVar31._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar27._8_4_;
          auVar31._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar27._12_4_;
          auVar31._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar27._16_4_;
          auVar31._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar27._20_4_;
          auVar31._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar27._24_4_;
          auVar31._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar27._28_4_;
          auVar31._32_4_ = (uint)(bVar9 & 1) * auVar27._32_4_;
          auVar31._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar27._36_4_;
          auVar31._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar27._40_4_;
          auVar31._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar27._44_4_;
          auVar31._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar27._48_4_;
          auVar31._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar27._52_4_;
          auVar31._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar27._56_4_;
          auVar31._60_4_ = (uint)(bVar9 >> 7) * auVar27._60_4_;
          auVar27 = vpmulld_avx512f(auVar31,auVar28);
          uVar18 = uVar18 + 0x10;
        } while ((uVar15 + 0xf & 0x1fffffff0) != uVar18);
        auVar26 = vmovdqa32_avx512f(auVar27);
        auVar32._0_4_ = (uint)(bVar8 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar28._0_4_
        ;
        bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar32._4_4_ = (uint)bVar4 * auVar26._4_4_ | (uint)!bVar4 * auVar28._4_4_;
        bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar32._8_4_ = (uint)bVar4 * auVar26._8_4_ | (uint)!bVar4 * auVar28._8_4_;
        bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar32._12_4_ = (uint)bVar4 * auVar26._12_4_ | (uint)!bVar4 * auVar28._12_4_;
        bVar4 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar32._16_4_ = (uint)bVar4 * auVar26._16_4_ | (uint)!bVar4 * auVar28._16_4_;
        bVar4 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar32._20_4_ = (uint)bVar4 * auVar26._20_4_ | (uint)!bVar4 * auVar28._20_4_;
        bVar4 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar32._24_4_ = (uint)bVar4 * auVar26._24_4_ | (uint)!bVar4 * auVar28._24_4_;
        bVar4 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar32._28_4_ = (uint)bVar4 * auVar26._28_4_ | (uint)!bVar4 * auVar28._28_4_;
        auVar32._32_4_ =
             (uint)(bVar9 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar28._32_4_;
        bVar4 = (bool)(bVar9 >> 1 & 1);
        auVar32._36_4_ = (uint)bVar4 * auVar26._36_4_ | (uint)!bVar4 * auVar28._36_4_;
        bVar4 = (bool)(bVar9 >> 2 & 1);
        auVar32._40_4_ = (uint)bVar4 * auVar26._40_4_ | (uint)!bVar4 * auVar28._40_4_;
        bVar4 = (bool)(bVar9 >> 3 & 1);
        auVar32._44_4_ = (uint)bVar4 * auVar26._44_4_ | (uint)!bVar4 * auVar28._44_4_;
        bVar4 = (bool)(bVar9 >> 4 & 1);
        auVar32._48_4_ = (uint)bVar4 * auVar26._48_4_ | (uint)!bVar4 * auVar28._48_4_;
        bVar4 = (bool)(bVar9 >> 5 & 1);
        auVar32._52_4_ = (uint)bVar4 * auVar26._52_4_ | (uint)!bVar4 * auVar28._52_4_;
        bVar4 = (bool)(bVar9 >> 6 & 1);
        auVar32._56_4_ = (uint)bVar4 * auVar26._56_4_ | (uint)!bVar4 * auVar28._56_4_;
        auVar32._60_4_ =
             (uint)(bVar9 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar28._60_4_;
        auVar22 = vextracti64x4_avx512f(auVar32,1);
        auVar26 = vpmulld_avx512f(auVar32,ZEXT3264(auVar22));
        auVar5 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
        auVar6 = vpshufd_avx(auVar5,0xee);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        auVar6 = vpshufd_avx(auVar5,0x55);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        iVar38 = auVar5._0_4_;
      }
      local_48 = pTVar2->v;
      local_80 = (ulong)(pTVar2->d).d[0];
      iVar41 = 1;
      iVar40 = 1;
      if (uVar15 != 0) {
        auVar26 = vpbroadcastq_avx512f();
        uVar18 = 0;
        auVar27 = vmovdqa64_avx512f(auVar23);
        do {
          auVar28 = vmovdqa64_avx512f(auVar27);
          auVar27 = vpbroadcastq_avx512f();
          auVar29 = vporq_avx512f(auVar27,auVar24);
          auVar27 = vporq_avx512f(auVar27,auVar25);
          uVar7 = vpcmpuq_avx512f(auVar27,auVar26,2);
          bVar8 = (byte)uVar7;
          uVar7 = vpcmpuq_avx512f(auVar29,auVar26,2);
          bVar9 = (byte)uVar7;
          uVar21 = CONCAT11(bVar9,bVar8);
          auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar18));
          auVar33._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar27._4_4_;
          auVar33._0_4_ = (uint)(bVar8 & 1) * auVar27._0_4_;
          auVar33._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar27._8_4_;
          auVar33._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar27._12_4_;
          auVar33._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar27._16_4_;
          auVar33._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar27._20_4_;
          auVar33._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar27._24_4_;
          auVar33._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar27._28_4_;
          auVar33._32_4_ = (uint)(bVar9 & 1) * auVar27._32_4_;
          auVar33._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar27._36_4_;
          auVar33._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar27._40_4_;
          auVar33._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar27._44_4_;
          auVar33._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar27._48_4_;
          auVar33._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar27._52_4_;
          auVar33._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar27._56_4_;
          auVar33._60_4_ = (uint)(bVar9 >> 7) * auVar27._60_4_;
          auVar27 = vpmulld_avx512f(auVar33,auVar28);
          uVar18 = uVar18 + 0x10;
        } while ((uVar15 + 0xf & 0x1fffffff0) != uVar18);
        auVar26 = vmovdqa32_avx512f(auVar27);
        auVar34._0_4_ = (uint)(bVar8 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar28._0_4_
        ;
        bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar34._4_4_ = (uint)bVar4 * auVar26._4_4_ | (uint)!bVar4 * auVar28._4_4_;
        bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar34._8_4_ = (uint)bVar4 * auVar26._8_4_ | (uint)!bVar4 * auVar28._8_4_;
        bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar34._12_4_ = (uint)bVar4 * auVar26._12_4_ | (uint)!bVar4 * auVar28._12_4_;
        bVar4 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar34._16_4_ = (uint)bVar4 * auVar26._16_4_ | (uint)!bVar4 * auVar28._16_4_;
        bVar4 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar34._20_4_ = (uint)bVar4 * auVar26._20_4_ | (uint)!bVar4 * auVar28._20_4_;
        bVar4 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar34._24_4_ = (uint)bVar4 * auVar26._24_4_ | (uint)!bVar4 * auVar28._24_4_;
        bVar4 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar34._28_4_ = (uint)bVar4 * auVar26._28_4_ | (uint)!bVar4 * auVar28._28_4_;
        auVar34._32_4_ =
             (uint)(bVar9 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar28._32_4_;
        bVar4 = (bool)(bVar9 >> 1 & 1);
        auVar34._36_4_ = (uint)bVar4 * auVar26._36_4_ | (uint)!bVar4 * auVar28._36_4_;
        bVar4 = (bool)(bVar9 >> 2 & 1);
        auVar34._40_4_ = (uint)bVar4 * auVar26._40_4_ | (uint)!bVar4 * auVar28._40_4_;
        bVar4 = (bool)(bVar9 >> 3 & 1);
        auVar34._44_4_ = (uint)bVar4 * auVar26._44_4_ | (uint)!bVar4 * auVar28._44_4_;
        bVar4 = (bool)(bVar9 >> 4 & 1);
        auVar34._48_4_ = (uint)bVar4 * auVar26._48_4_ | (uint)!bVar4 * auVar28._48_4_;
        bVar4 = (bool)(bVar9 >> 5 & 1);
        auVar34._52_4_ = (uint)bVar4 * auVar26._52_4_ | (uint)!bVar4 * auVar28._52_4_;
        bVar4 = (bool)(bVar9 >> 6 & 1);
        auVar34._56_4_ = (uint)bVar4 * auVar26._56_4_ | (uint)!bVar4 * auVar28._56_4_;
        auVar34._60_4_ =
             (uint)(bVar9 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar28._60_4_;
        auVar22 = vextracti64x4_avx512f(auVar34,1);
        auVar26 = vpmulld_avx512f(auVar34,ZEXT3264(auVar22));
        auVar5 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
        auVar6 = vpshufd_avx(auVar5,0xee);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        auVar6 = vpshufd_avx(auVar5,0x55);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        iVar40 = auVar5._0_4_;
      }
      if (uVar15 != 0) {
        auVar26 = vpbroadcastq_avx512f();
        uVar18 = 0;
        auVar23 = vmovdqa64_avx512f(auVar23);
        do {
          auVar27 = vmovdqa64_avx512f(auVar23);
          auVar23 = vpbroadcastq_avx512f();
          auVar28 = vporq_avx512f(auVar23,auVar24);
          auVar23 = vporq_avx512f(auVar23,auVar25);
          uVar7 = vpcmpuq_avx512f(auVar23,auVar26,2);
          bVar8 = (byte)uVar7;
          uVar7 = vpcmpuq_avx512f(auVar28,auVar26,2);
          bVar9 = (byte)uVar7;
          uVar21 = CONCAT11(bVar9,bVar8);
          auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar18));
          auVar35._4_4_ = (uint)((byte)(uVar21 >> 1) & 1) * auVar23._4_4_;
          auVar35._0_4_ = (uint)(bVar8 & 1) * auVar23._0_4_;
          auVar35._8_4_ = (uint)((byte)(uVar21 >> 2) & 1) * auVar23._8_4_;
          auVar35._12_4_ = (uint)((byte)(uVar21 >> 3) & 1) * auVar23._12_4_;
          auVar35._16_4_ = (uint)((byte)(uVar21 >> 4) & 1) * auVar23._16_4_;
          auVar35._20_4_ = (uint)((byte)(uVar21 >> 5) & 1) * auVar23._20_4_;
          auVar35._24_4_ = (uint)((byte)(uVar21 >> 6) & 1) * auVar23._24_4_;
          auVar35._28_4_ = (uint)((byte)(uVar21 >> 7) & 1) * auVar23._28_4_;
          auVar35._32_4_ = (uint)(bVar9 & 1) * auVar23._32_4_;
          auVar35._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar23._36_4_;
          auVar35._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar23._40_4_;
          auVar35._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar23._44_4_;
          auVar35._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar23._48_4_;
          auVar35._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar23._52_4_;
          auVar35._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar23._56_4_;
          auVar35._60_4_ = (uint)(bVar9 >> 7) * auVar23._60_4_;
          auVar23 = vpmulld_avx512f(auVar35,auVar27);
          uVar18 = uVar18 + 0x10;
        } while ((uVar15 + 0xf & 0x1fffffff0) != uVar18);
        auVar23 = vmovdqa32_avx512f(auVar23);
        auVar36._0_4_ = (uint)(bVar8 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar27._0_4_
        ;
        bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
        auVar36._4_4_ = (uint)bVar4 * auVar23._4_4_ | (uint)!bVar4 * auVar27._4_4_;
        bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
        auVar36._8_4_ = (uint)bVar4 * auVar23._8_4_ | (uint)!bVar4 * auVar27._8_4_;
        bVar4 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar36._12_4_ = (uint)bVar4 * auVar23._12_4_ | (uint)!bVar4 * auVar27._12_4_;
        bVar4 = (bool)((byte)(uVar21 >> 4) & 1);
        auVar36._16_4_ = (uint)bVar4 * auVar23._16_4_ | (uint)!bVar4 * auVar27._16_4_;
        bVar4 = (bool)((byte)(uVar21 >> 5) & 1);
        auVar36._20_4_ = (uint)bVar4 * auVar23._20_4_ | (uint)!bVar4 * auVar27._20_4_;
        bVar4 = (bool)((byte)(uVar21 >> 6) & 1);
        auVar36._24_4_ = (uint)bVar4 * auVar23._24_4_ | (uint)!bVar4 * auVar27._24_4_;
        bVar4 = (bool)((byte)(uVar21 >> 7) & 1);
        auVar36._28_4_ = (uint)bVar4 * auVar23._28_4_ | (uint)!bVar4 * auVar27._28_4_;
        auVar36._32_4_ =
             (uint)(bVar9 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar27._32_4_;
        bVar4 = (bool)(bVar9 >> 1 & 1);
        auVar36._36_4_ = (uint)bVar4 * auVar23._36_4_ | (uint)!bVar4 * auVar27._36_4_;
        bVar4 = (bool)(bVar9 >> 2 & 1);
        auVar36._40_4_ = (uint)bVar4 * auVar23._40_4_ | (uint)!bVar4 * auVar27._40_4_;
        bVar4 = (bool)(bVar9 >> 3 & 1);
        auVar36._44_4_ = (uint)bVar4 * auVar23._44_4_ | (uint)!bVar4 * auVar27._44_4_;
        bVar4 = (bool)(bVar9 >> 4 & 1);
        auVar36._48_4_ = (uint)bVar4 * auVar23._48_4_ | (uint)!bVar4 * auVar27._48_4_;
        bVar4 = (bool)(bVar9 >> 5 & 1);
        auVar36._52_4_ = (uint)bVar4 * auVar23._52_4_ | (uint)!bVar4 * auVar27._52_4_;
        bVar4 = (bool)(bVar9 >> 6 & 1);
        auVar36._56_4_ = (uint)bVar4 * auVar23._56_4_ | (uint)!bVar4 * auVar27._56_4_;
        auVar36._60_4_ =
             (uint)(bVar9 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar27._60_4_;
        auVar22 = vextracti64x4_avx512f(auVar36,1);
        auVar23 = vpmulld_avx512f(auVar36,ZEXT3264(auVar22));
        auVar5 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
        auVar6 = vpshufd_avx(auVar5,0xee);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        auVar6 = vpshufd_avx(auVar5,0x55);
        auVar5 = vpmulld_avx(auVar5,auVar6);
        iVar41 = auVar5._0_4_;
      }
      local_90 = local_48 + (uVar20 % uVar37) * iVar39;
      local_78 = local_48 + ((uVar20 + 1) % uVar37) * iVar38;
      local_60 = local_48 + ((uVar20 + 2) % uVar37) * iVar40;
      local_48 = local_48 + ((uVar20 + 3) % uVar37) * iVar41;
      local_68 = local_80;
      local_50 = local_80;
      local_38 = local_80;
      if ((local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value != local_80) ||
         (local_108.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value != uVar14)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                     );
      }
      local_c0.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_data = local_108.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_c0.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_outerStride.m_value =
           local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_e0.m_dst = &local_c0;
      local_e0.m_src = (SrcEvaluatorType *)local_a8;
      local_e0.m_functor = &local_115;
      local_e0.m_dstExpr = &local_108;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::add_assign_op<float,_float>,_0>,_3,_0>
      ::run(&local_e0);
      uVar20 = uVar20 + 4;
      auVar23 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (uVar20 < local_114);
  }
  return;
}

Assistant:

void SumBatches::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  assert(i == 0);
#if HAVE_CUDA
  for (unsigned i = 0; i < dEdxi.d.bd; ++i)
    CUBLAS_CHECK(cublasSaxpy(cublas_handle, fx.d.size(), kSCALAR_ONE, dEdf.v, 1, dEdxi.v + i * dEdxi.d.batch_size(), 1));
#else
  for (unsigned i = 0; i < dEdxi.d.bd; ++i)
    dEdxi.batch_matrix(i) += *dEdf;
#endif
}